

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O3

void opengv::absolute_pose::modules::gpnp4::groebnerRow19_0000_f
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  lVar6 = (long)targetRow;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar6 + 0x307];
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar7 = vxorpd_avx512vl(auVar8,auVar5);
  auVar9._0_8_ = auVar7._0_8_ /
                 (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[0x31a];
  auVar9._8_8_ = auVar7._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar6 + 0x307] = 0.0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x333];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar6 + 800];
  auVar7 = vfmadd213sd_fma(auVar10,auVar9,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar6 + 800] = auVar7._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x34c];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar6 + 0x339];
  auVar7 = vfmadd213sd_fma(auVar11,auVar9,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar6 + 0x339] = auVar7._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x365];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar6 + 0x352];
  auVar7 = vfmadd213sd_fma(auVar12,auVar9,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar6 + 0x352] = auVar7._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x37e];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar6 + 0x36b];
  auVar7 = vfmadd213sd_fma(auVar13,auVar9,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar6 + 0x36b] = auVar7._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x397];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar6 + 900];
  auVar7 = vfmadd213sd_fma(auVar14,auVar9,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar6 + 900] = auVar7._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::groebnerRow19_0000_f( Eigen::Matrix<double,25,37> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,31) / groebnerMatrix(19,31);
  groebnerMatrix(targetRow,31) = 0.0;
  groebnerMatrix(targetRow,32) -= factor * groebnerMatrix(19,32);
  groebnerMatrix(targetRow,33) -= factor * groebnerMatrix(19,33);
  groebnerMatrix(targetRow,34) -= factor * groebnerMatrix(19,34);
  groebnerMatrix(targetRow,35) -= factor * groebnerMatrix(19,35);
  groebnerMatrix(targetRow,36) -= factor * groebnerMatrix(19,36);
}